

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

base_learner * bfgs_setup(options_i *options,vw *all)

{
  size_t sVar1;
  vw *pvVar2;
  pointer pbVar3;
  unsigned_long uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<bfgs,_example> *l;
  _func_void_bfgs_ptr_base_learner_ptr_example_ptr *learn_ptr;
  stringstream __msg;
  option_group_definition bfgs_inner_options;
  option_group_definition bfgs_outer_options;
  bool bfgs_option;
  bool conjugate_gradient;
  free_ptr<bfgs> b;
  undefined4 in_stack_fffffffffffff738;
  uint32_t in_stack_fffffffffffff73c;
  typed_option<float> *in_stack_fffffffffffff740;
  string *in_stack_fffffffffffff748;
  typed_option<float> *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  uint32_t in_stack_fffffffffffff75c;
  learner<bfgs,_example> *in_stack_fffffffffffff760;
  int plineNumber;
  string *in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  typed_option<float> *in_stack_fffffffffffff788;
  option_group_definition *in_stack_fffffffffffff790;
  learner<bfgs,_example> *local_798;
  typed_option<float> *local_790;
  stringstream local_760 [16];
  ostream local_750;
  allocator local_5d1;
  string local_5d0 [32];
  undefined4 local_5b0;
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [199];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [199];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [199];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  typed_option<bool> local_290;
  allocator local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [63];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  vw *local_18;
  undefined8 *local_10;
  typed_option<float> *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<bfgs>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"LBFGS and Conjugate Gradient options",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"conjugate_gradient",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffff748,(bool *)in_stack_fffffffffffff740);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"use conjugate gradient based optimization",&local_189);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff790,(typed_option<bool> *)in_stack_fffffffffffff788);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff740);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"LBFGS and Conjugate Gradient options",&local_1e9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"bfgs",&local_2b1);
  VW::config::make_option<bool>(in_stack_fffffffffffff748,(bool *)in_stack_fffffffffffff740);
  VW::config::typed_option<bool>::keep(&local_290,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"use conjugate gradient based optimization",&local_2d9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff790,(typed_option<bool> *)in_stack_fffffffffffff788);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff740);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"hessian_on",&local_3a1);
  VW::config::make_option<bool>(in_stack_fffffffffffff748,(bool *)in_stack_fffffffffffff740);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"use second derivative in line search",&local_3c9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff790,(typed_option<bool> *)in_stack_fffffffffffff788);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff740);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"mem",&local_491);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
            ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f2bf);
  VW::config::make_option<int>(in_stack_fffffffffffff748,(int *)in_stack_fffffffffffff740);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff750,
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"memory in bfgs",&local_4b9);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_fffffffffffff790,(typed_option<int> *)in_stack_fffffffffffff788);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff740);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"termination",&local_581);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
            ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f3e3);
  VW::config::make_option<float>(in_stack_fffffffffffff748,(float *)in_stack_fffffffffffff740);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff750,(float)((ulong)in_stack_fffffffffffff748 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"Termination threshold",&local_5a9);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff740,
             (string *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff740);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  (**(code **)*local_10)(local_10,local_68);
  if (((local_29 & 1) == 0) && ((**(code **)*local_10)(local_10,local_1c8), (local_2a & 1) == 0)) {
    local_8 = (typed_option<float> *)0x0;
  }
  else {
    pvVar2 = local_18;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f96d);
    pbVar3->all = pvVar2;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f982);
    pbVar3->wolfe1_bound = 0.01;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f99c);
    pbVar3->first_hessian_on = true;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f9b0);
    pbVar3->first_pass = true;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f9c4);
    pbVar3->gradient_pass = true;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f9d8);
    pbVar3->preconditioner_pass = true;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23f9ec);
    pbVar3->backstep_on = false;
    sVar1 = local_18->numpasses;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fa17);
    pbVar3->final_pass = sVar1;
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fa30);
    pbVar3->no_win_counter = 0;
    if ((local_18->holdout_set_off & 1U) == 0) {
      local_18->sd->holdout_best_loss = 3.4028234663852886e+38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d0,"early_terminate",&local_5d1);
      VW::config::options_i::get_typed_option<unsigned_long>
                ((options_i *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                 in_stack_fffffffffffff768);
      uVar4 = VW::config::typed_option<unsigned_long>::value
                        ((typed_option<unsigned_long> *)in_stack_fffffffffffff740);
      pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                         ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fadd);
      pbVar3->early_stop_thres = uVar4;
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    }
    pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fb5b);
    if (pbVar3->m == 0) {
      local_18->hessian_on = true;
    }
    if ((local_18->quiet & 1U) == 0) {
      pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                         ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fb92);
      if (pbVar3->m < 1) {
        pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fbcc);
        std::operator<<(&(pbVar3->all->trace_message).super_ostream,
                        "enabling conjugate gradient optimization via BFGS ");
      }
      else {
        pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fba5);
        std::operator<<(&(pbVar3->all->trace_message).super_ostream,
                        "enabling BFGS based optimization ");
      }
      if ((local_18->hessian_on & 1U) == 0) {
        pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fc43);
        poVar5 = std::operator<<(&(pbVar3->all->trace_message).super_ostream,
                                 "**without** curvature calculation");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        pbVar3 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x23fc04);
        poVar5 = std::operator<<(&(pbVar3->all->trace_message).super_ostream,
                                 "with curvature calculation");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    if ((local_18->numpasses < 2) && ((local_18->training & 1U) != 0)) {
      std::__cxx11::stringstream::stringstream(local_760);
      plineNumber = (int)((ulong)in_stack_fffffffffffff760 >> 0x20);
      std::operator<<(&local_750,"you must make at least 2 passes to use BFGS");
      uVar6 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                 (char *)in_stack_fffffffffffff768,plineNumber,
                 (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_18->bfgs = true;
    parameters::stride_shift((parameters *)in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
    if ((local_18->audit & 1U) == 0) {
      local_790 = (typed_option<float> *)learn<false>;
    }
    else {
      local_790 = (typed_option<float> *)learn<true>;
    }
    if (((local_18->audit & 1U) == 0) && ((local_18->hash_inv & 1U) == 0)) {
      in_stack_fffffffffffff75c =
           parameters::stride((parameters *)
                              CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      local_798 = LEARNER::init_learner<bfgs,example,LEARNER::learner<char,char>>
                            ((free_ptr<bfgs> *)local_790,
                             (_func_void_bfgs_ptr_learner<char,_char>_ptr_example_ptr *)
                             in_stack_fffffffffffff748,
                             (_func_void_bfgs_ptr_learner<char,_char>_ptr_example_ptr *)
                             in_stack_fffffffffffff740,
                             CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
    }
    else {
      parameters::stride((parameters *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)
                        );
      in_stack_fffffffffffff760 =
           LEARNER::init_learner<bfgs,example,LEARNER::learner<char,char>>
                     ((free_ptr<bfgs> *)in_stack_fffffffffffff750,
                      (_func_void_bfgs_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_fffffffffffff748,
                      (_func_void_bfgs_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_fffffffffffff740,
                      CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      local_790 = in_stack_fffffffffffff750;
      local_798 = in_stack_fffffffffffff760;
    }
    LEARNER::learner<bfgs,_example>::set_save_load(local_798,save_load);
    LEARNER::learner<bfgs,_example>::set_init_driver
              (in_stack_fffffffffffff760,
               (_func_void_bfgs_ptr *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758))
    ;
    LEARNER::learner<bfgs,_example>::set_end_pass
              (in_stack_fffffffffffff760,
               (_func_void_bfgs_ptr *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758))
    ;
    LEARNER::learner<bfgs,_example>::set_finish
              (in_stack_fffffffffffff760,
               (_func_void_bfgs_ptr *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758))
    ;
    in_stack_fffffffffffff740 = (typed_option<float> *)LEARNER::make_base<bfgs,example>(local_798);
    in_stack_fffffffffffff750 = local_790;
    local_8 = in_stack_fffffffffffff740;
  }
  local_5b0 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff740);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff740);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<bfgs,_void_(*)(void_*)> *)in_stack_fffffffffffff750);
  return (base_learner *)local_8;
}

Assistant:

base_learner* bfgs_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<bfgs>();
  bool conjugate_gradient = false;
  bool bfgs_option = false;
  option_group_definition bfgs_outer_options("LBFGS and Conjugate Gradient options");
  bfgs_outer_options.add(
      make_option("conjugate_gradient", conjugate_gradient).keep().help("use conjugate gradient based optimization"));

  option_group_definition bfgs_inner_options("LBFGS and Conjugate Gradient options");
  bfgs_inner_options.add(make_option("bfgs", bfgs_option).keep().help("use conjugate gradient based optimization"));
  bfgs_inner_options.add(make_option("hessian_on", all.hessian_on).help("use second derivative in line search"));
  bfgs_inner_options.add(make_option("mem", b->m).default_value(15).help("memory in bfgs"));
  bfgs_inner_options.add(
      make_option("termination", b->rel_threshold).default_value(0.001f).help("Termination threshold"));

  options.add_and_parse(bfgs_outer_options);
  if (!conjugate_gradient)
  {
    options.add_and_parse(bfgs_inner_options);
    if (!bfgs_option)
    {
      return nullptr;
    }
  }

  b->all = &all;
  b->wolfe1_bound = 0.01;
  b->first_hessian_on = true;
  b->first_pass = true;
  b->gradient_pass = true;
  b->preconditioner_pass = true;
  b->backstep_on = false;
  b->final_pass = all.numpasses;
  b->no_win_counter = 0;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (b->m == 0)
    all.hessian_on = true;

  if (!all.quiet)
  {
    if (b->m > 0)
      b->all->trace_message << "enabling BFGS based optimization ";
    else
      b->all->trace_message << "enabling conjugate gradient optimization via BFGS ";
    if (all.hessian_on)
      b->all->trace_message << "with curvature calculation" << endl;
    else
      b->all->trace_message << "**without** curvature calculation" << endl;
  }

  if (all.numpasses < 2 && all.training)
    THROW("you must make at least 2 passes to use BFGS");

  all.bfgs = true;
  all.weights.stride_shift(2);

  void (*learn_ptr)(bfgs&, base_learner&, example&) = nullptr;
  if (all.audit)
        learn_ptr = learn<true>;
  else
        learn_ptr = learn<false>;

    learner<bfgs, example>* l;
  if (all.audit || all.hash_inv)
        l = &init_learner(b, learn_ptr, predict<true>, all.weights.stride());
  else
        l = &init_learner(b, learn_ptr, predict<false>, all.weights.stride());

  l->set_save_load(save_load);
  l->set_init_driver(init_driver);
  l->set_end_pass(end_pass);
  l->set_finish(finish);

  return make_base(*l);
}